

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::MinTypMaxExpression::fromSyntax
          (Compilation *compilation,MinTypMaxExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  MinTypMax MVar1;
  ExpressionSyntax *pEVar2;
  Type *args;
  bool bVar3;
  ulong uVar4;
  Expression *args_1;
  Expression *args_2;
  Expression *args_3;
  MinTypMaxExpression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  char *func;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  Expression *selected;
  Expression *local_50;
  bitmask<slang::ast::ASTFlags> local_48;
  SourceRange local_40;
  
  uVar4 = (ulong)(compilation->options).minTypMax;
  local_48.m_bits = 2;
  extraFlags_00.m_bits = 2;
  extraFlags.m_bits = 2;
  if (uVar4 < 3) {
    local_48.m_bits = *(underlying_type *)(&DAT_00434080 + uVar4 * 8);
    extraFlags_00.m_bits = *(underlying_type *)(&DAT_00434098 + uVar4 * 8);
    extraFlags.m_bits = *(underlying_type *)(&DAT_004340b0 + uVar4 * 8);
  }
  pEVar2 = (syntax->min).ptr;
  if (pEVar2 != (ExpressionSyntax *)0x0) {
    args_1 = Expression::create(compilation,pEVar2,context,extraFlags,assignmentTarget);
    pEVar2 = (syntax->typ).ptr;
    if (pEVar2 != (ExpressionSyntax *)0x0) {
      args_2 = Expression::create(compilation,pEVar2,context,extraFlags_00,assignmentTarget);
      pEVar2 = (syntax->max).ptr;
      if (pEVar2 != (ExpressionSyntax *)0x0) {
        args_3 = Expression::create(compilation,pEVar2,context,local_48,assignmentTarget);
        MVar1 = (compilation->options).minTypMax;
        local_50 = args_3;
        if ((MVar1 != Max) && (local_50 = args_1, MVar1 == Typ)) {
          local_50 = args_2;
        }
        args = (local_50->type).ptr;
        if (args != (Type *)0x0) {
          local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          expr = BumpAllocator::
                 emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
                           (&compilation->super_BumpAllocator,args,args_1,args_2,args_3,&local_50,
                            &local_40);
          bVar3 = Expression::bad(args_1);
          if (((bVar3) || (bVar3 = Expression::bad(args_2), bVar3)) ||
             (bVar3 = Expression::bad(args_3), bVar3)) {
            expr = (MinTypMaxExpression *)Expression::badExpr(compilation,&expr->super_Expression);
          }
          return &expr->super_Expression;
        }
        func = 
        "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
        goto LAB_003bcf5a;
      }
    }
  }
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_003bcf5a:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& MinTypMaxExpression::fromSyntax(Compilation& compilation,
                                            const MinTypMaxExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* assignmentTarget) {
    // Only one of the expressions will be considered evaluated.
    auto minFlags = ASTFlags::UnevaluatedBranch;
    auto typFlags = ASTFlags::UnevaluatedBranch;
    auto maxFlags = ASTFlags::UnevaluatedBranch;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            minFlags = ASTFlags::None;
            break;
        case MinTypMax::Typ:
            typFlags = ASTFlags::None;
            break;
        case MinTypMax::Max:
            maxFlags = ASTFlags::None;
            break;
    }

    auto& min = create(compilation, *syntax.min, context, minFlags, assignmentTarget);
    auto& typ = create(compilation, *syntax.typ, context, typFlags, assignmentTarget);
    auto& max = create(compilation, *syntax.max, context, maxFlags, assignmentTarget);

    Expression* selected = nullptr;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            selected = &min;
            break;
        case MinTypMax::Typ:
            selected = &typ;
            break;
        case MinTypMax::Max:
            selected = &max;
            break;
    }

    auto result = compilation.emplace<MinTypMaxExpression>(*selected->type, min, typ, max, selected,
                                                           syntax.sourceRange());
    if (min.bad() || typ.bad() || max.bad())
        return badExpr(compilation, result);

    return *result;
}